

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# world.cpp
# Opt level: O3

Item * __thiscall World::add_gold_item(World *this,uint8_t worth)

{
  _Rb_tree_header *p_Var1;
  uint16_t gold_value;
  undefined1 uVar2;
  _Base_ptr p_Var3;
  mapped_type *ppIVar4;
  Item *item;
  _Base_ptr p_Var5;
  undefined7 in_register_00000031;
  uint8_t id;
  bool bVar6;
  undefined1 local_31;
  
  gold_value = (uint16_t)CONCAT71(in_register_00000031,worth);
  local_31 = 0x40;
  p_Var3 = (this->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  if (p_Var3 == (_Base_ptr)0x0) {
    id = '@';
  }
  else {
    p_Var1 = &(this->_items)._M_t._M_impl.super__Rb_tree_header;
    id = '@';
    p_Var5 = &p_Var1->_M_header;
    while( true ) {
      do {
        uVar2 = local_31;
        bVar6 = (byte)(char)p_Var3[1]._M_color < (byte)local_31;
        if (!bVar6) {
          p_Var5 = p_Var3;
        }
        p_Var3 = (&p_Var3->_M_left)[bVar6];
      } while (p_Var3 != (_Base_ptr)0x0);
      if (((_Rb_tree_header *)p_Var5 == p_Var1) || ((byte)local_31 < (byte)(char)p_Var5[1]._M_color)
         ) break;
      ppIVar4 = std::
                map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                ::operator[](&this->_items,&local_31);
      if ((*ppIVar4)->_gold_value == gold_value) {
        ppIVar4 = std::
                  map<unsigned_char,_Item_*,_std::less<unsigned_char>,_std::allocator<std::pair<const_unsigned_char,_Item_*>_>_>
                  ::operator[](&this->_items,&local_31);
        return *ppIVar4;
      }
      id = uVar2 + _S_black;
      local_31 = local_31 + _S_black;
      if ((0x6f < (byte)local_31) ||
         (p_Var3 = (this->_items)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
         p_Var5 = &p_Var1->_M_header, p_Var3 == (_Base_ptr)0x0)) break;
    }
  }
  if (id == 'p') {
    item = (Item *)0x0;
  }
  else {
    item = (Item *)operator_new(0x40);
    ItemGolds::ItemGolds((ItemGolds *)item,id,gold_value);
    add_item(this,item);
  }
  return item;
}

Assistant:

Item* World::add_gold_item(uint8_t worth)
{
    uint8_t first_available_id = ITEM_GOLDS_START;

    // Try to find an item with the same worth
    for(uint8_t i=ITEM_GOLDS_START ; i<ITEM_GOLDS_END ; ++i)
    {
        if(_items.count(i) == 0)
            break;

        first_available_id = i+1;
        if(_items[i]->gold_value() == worth)
            return _items[i];
    }

    // If we consumed all item IDs, don't add it you fool!
    if(first_available_id == ITEM_GOLDS_END)
        return nullptr;

    return this->add_item(new ItemGolds(first_available_id, worth));
}